

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v5::internal::grisu2_gen_digits
               (fp *scaled_value,fp *scaled_upper,uint64_t delta,char *buffer,size_t *size,
               int *dec_exp)

{
  size_t sVar1;
  char cVar2;
  char digit_1;
  uint64_t remainder;
  uint32_t digit;
  uint exp;
  uint64_t lo;
  undefined1 auStack_48 [4];
  uint32_t hi;
  fp one;
  int *dec_exp_local;
  size_t *size_local;
  char *buffer_local;
  uint64_t delta_local;
  fp *scaled_upper_local;
  fp *scaled_value_local;
  
  one._8_8_ = dec_exp;
  fp::fp((fp *)auStack_48,1L << (-(char)scaled_upper->e & 0x3fU),scaled_upper->e);
  lo._4_4_ = (uint32_t)(scaled_upper->f >> (-(char)one.f & 0x3fU));
  _digit = (char *)(scaled_upper->f & _auStack_48 - 1);
  *size = 0;
  remainder._4_4_ = count_digits(lo._4_4_);
  do {
    buffer_local = (char *)delta;
    if (remainder._4_4_ == 0) {
      do {
        buffer_local = (char *)((long)buffer_local * 10);
        cVar2 = (char)((ulong)((long)_digit * 10) >> (-(char)one.f & 0x3fU));
        if ((cVar2 != '\0') || (*size != 0)) {
          sVar1 = *size;
          *size = sVar1 + 1;
          buffer[sVar1] = cVar2 + '0';
        }
        _digit = (char *)(_auStack_48 - 1 & (long)_digit * 10);
        remainder._4_4_ = remainder._4_4_ - 1;
      } while (buffer_local <= _digit);
      *(uint *)one._8_8_ = remainder._4_4_ + *(int *)one._8_8_;
      return;
    }
    switch(remainder._4_4_) {
    case 1:
      remainder._0_4_ = lo._4_4_;
      lo._4_4_ = 0;
      break;
    case 2:
      remainder._0_4_ = lo._4_4_ / 10;
      lo._4_4_ = lo._4_4_ % 10;
      break;
    case 3:
      remainder._0_4_ = lo._4_4_ / 100;
      lo._4_4_ = lo._4_4_ % 100;
      break;
    case 4:
      remainder._0_4_ = lo._4_4_ / 1000;
      lo._4_4_ = lo._4_4_ % 1000;
      break;
    case 5:
      remainder._0_4_ = lo._4_4_ / 10000;
      lo._4_4_ = lo._4_4_ % 10000;
      break;
    case 6:
      remainder._0_4_ = lo._4_4_ / 100000;
      lo._4_4_ = lo._4_4_ % 100000;
      break;
    case 7:
      remainder._0_4_ = lo._4_4_ / 1000000;
      lo._4_4_ = lo._4_4_ % 1000000;
      break;
    case 8:
      remainder._0_4_ = lo._4_4_ / 10000000;
      lo._4_4_ = lo._4_4_ % 10000000;
      break;
    case 9:
      remainder._0_4_ = lo._4_4_ / 100000000;
      lo._4_4_ = lo._4_4_ % 100000000;
      break;
    case 10:
      remainder._0_4_ = lo._4_4_ / 1000000000;
      lo._4_4_ = lo._4_4_ % 1000000000;
      break;
    default:
      __assert_fail("(false) && \"invalid number of digits\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/lib/logging/spdlog/fmt/bundled/format-inl.h"
                    ,0x1e6,
                    "void fmt::internal::grisu2_gen_digits(const fp &, const fp &, uint64_t, char *, size_t &, int &)"
                   );
    }
    if (((uint)remainder != 0) || (*size != 0)) {
      sVar1 = *size;
      *size = sVar1 + 1;
      buffer[sVar1] = (char)(uint)remainder + '0';
    }
    remainder._4_4_ = remainder._4_4_ - 1;
  } while (delta < _digit + ((ulong)lo._4_4_ << (-(char)one.f & 0x3fU)));
  *(uint *)one._8_8_ = remainder._4_4_ + *(int *)one._8_8_;
  return;
}

Assistant:

FMT_FUNC void grisu2_gen_digits(
    const fp &scaled_value, const fp &scaled_upper, uint64_t delta,
    char *buffer, size_t &size, int &dec_exp) {
  internal::fp one(1ull << -scaled_upper.e, scaled_upper.e);
  // hi (p1 in Grisu) contains the most significant digits of scaled_upper.
  // hi = floor(scaled_upper / one).
  uint32_t hi = static_cast<uint32_t>(scaled_upper.f >> -one.e);
  // lo (p2 in Grisu) contains the least significants digits of scaled_upper.
  // lo = scaled_upper mod 1.
  uint64_t lo = scaled_upper.f & (one.f - 1);
  size = 0;
  auto exp = count_digits(hi);  // kappa in Grisu.
  while (exp > 0) {
    uint32_t digit = 0;
    // This optimization by miloyip reduces the number of integer divisions by
    // one per iteration.
    switch (exp) {
    case 10: digit = hi / 1000000000; hi %= 1000000000; break;
    case  9: digit = hi /  100000000; hi %=  100000000; break;
    case  8: digit = hi /   10000000; hi %=   10000000; break;
    case  7: digit = hi /    1000000; hi %=    1000000; break;
    case  6: digit = hi /     100000; hi %=     100000; break;
    case  5: digit = hi /      10000; hi %=      10000; break;
    case  4: digit = hi /       1000; hi %=       1000; break;
    case  3: digit = hi /        100; hi %=        100; break;
    case  2: digit = hi /         10; hi %=         10; break;
    case  1: digit = hi;              hi =           0; break;
    default:
      FMT_ASSERT(false, "invalid number of digits");
    }
    if (digit != 0 || size != 0)
      buffer[size++] = static_cast<char>('0' + digit);
    --exp;
    uint64_t remainder = (static_cast<uint64_t>(hi) << -one.e) + lo;
    if (remainder <= delta) {
      dec_exp += exp;
      // TODO: use scaled_value
      (void)scaled_value;
      return;
    }
  }
  for (;;) {
    lo *= 10;
    delta *= 10;
    char digit = static_cast<char>(lo >> -one.e);
    if (digit != 0 || size != 0)
      buffer[size++] = static_cast<char>('0' + digit);
    lo &= one.f - 1;
    --exp;
    if (lo < delta) {
      dec_exp += exp;
      return;
    }
  }
}